

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86_avx2::forward(Flatten_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  long lVar29;
  long lVar30;
  uint uVar31;
  undefined4 *puVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  int iVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  int iVar48;
  size_t _elemsize;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_e0;
  Mat local_78;
  
  iVar22 = bottom_blob->elempack;
  uVar40 = (ulong)iVar22;
  if ((uVar40 != 0) && (((int)bottom_blob->elemsize << 3) / iVar22 == 8)) {
    iVar22 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar22;
  }
  iVar37 = bottom_blob->dims;
  if (iVar37 == 1) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    if (opt->use_packing_layout != true) {
LAB_001aa123:
      iVar22 = Flatten::forward((Flatten *)
                                ((long)&this->_vptr_Flatten_x86_avx2 +
                                (long)this->_vptr_Flatten_x86_avx2[-3]),bottom_blob,top_blob,opt);
      return iVar22;
    }
    iVar44 = bottom_blob->w;
    lVar25 = (long)iVar44;
    uVar10 = bottom_blob->h;
    uVar11 = bottom_blob->c;
    uVar24 = (ulong)uVar11;
    iVar33 = uVar10 * iVar44 * bottom_blob->d;
    uVar31 = uVar11 * iVar22 * iVar33;
    if ((uVar31 & 7) == 0) {
      _elemsize = bottom_blob->elemsize / uVar40 << 3;
      iVar47 = 8;
    }
    else {
      _elemsize = bottom_blob->elemsize / uVar40 << ((uVar31 & 3) == 0) * '\x02';
      if ((uVar31 & 3) != 0) goto LAB_001aa123;
      iVar47 = 4;
    }
    if (iVar22 == 1 && iVar37 == 2) {
      Mat::operator=(top_blob,bottom_blob);
      top_blob->dims = 1;
      top_blob->w = (int)uVar31 / iVar47;
      top_blob->h = 1;
      top_blob->cstep = (long)((int)uVar31 / iVar47);
      top_blob->elemsize = _elemsize;
      top_blob->elempack = iVar47;
    }
    else {
      Mat::create(top_blob,(int)uVar31 / iVar47,_elemsize,iVar47,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar37 == 2) {
        if (iVar22 == 4) {
          uVar27 = 0;
          uVar40 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar40 = uVar27;
          }
          lVar30 = lVar25 * 4;
          lVar26 = lVar25 * 0x10;
          lVar43 = lVar25 * 8;
          lVar25 = lVar25 * 0xc;
          for (uVar42 = 0; uVar42 != uVar40; uVar42 = uVar42 + 1) {
            iVar47 = (int)uVar27;
            pvVar12 = top_blob->data;
            lVar34 = bottom_blob->elemsize * uVar42 * (long)bottom_blob->w;
            pvVar13 = bottom_blob->data;
            lVar35 = 0;
            for (iVar48 = 0; iVar48 + 3 < iVar44; iVar48 = iVar48 + 4) {
              auVar14 = *(undefined1 (*) [16])((long)pvVar13 + lVar35 * 4 + lVar34);
              auVar19 = *(undefined1 (*) [16])((long)pvVar13 + lVar35 * 4 + lVar34 + 0x10);
              auVar20 = *(undefined1 (*) [16])((long)pvVar13 + lVar35 * 4 + lVar34 + 0x20);
              auVar15 = *(undefined1 (*) [16])((long)pvVar13 + lVar35 * 4 + lVar34 + 0x30);
              auVar17 = vunpcklps_avx(auVar14,auVar19);
              auVar18 = vunpcklps_avx(auVar20,auVar15);
              auVar16 = vunpckhps_avx(auVar14,auVar19);
              auVar15 = vunpckhps_avx(auVar20,auVar15);
              auVar14 = vmovlhps_avx(auVar17,auVar18);
              auVar20 = vunpckhpd_avx(auVar17,auVar18);
              auVar19 = vmovlhps_avx(auVar16,auVar15);
              auVar15 = vunpckhpd_avx(auVar16,auVar15);
              *(undefined1 (*) [16])((long)pvVar12 + lVar35 + (long)iVar47 * 4) = auVar14;
              *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar30) = auVar20;
              *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar43) = auVar19;
              *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar25) = auVar15;
              lVar35 = lVar35 + 0x10;
            }
            for (; iVar48 < iVar44; iVar48 = iVar48 + 1) {
              *(undefined4 *)((long)pvVar12 + lVar35 + (long)iVar47 * 4) =
                   *(undefined4 *)((long)pvVar13 + lVar35 * 4 + lVar34);
              *(undefined4 *)((long)pvVar12 + lVar35 + lVar30) =
                   *(undefined4 *)((long)pvVar13 + lVar35 * 4 + lVar34 + 4);
              *(undefined4 *)((long)pvVar12 + lVar35 + lVar43) =
                   *(undefined4 *)((long)pvVar13 + lVar35 * 4 + lVar34 + 8);
              *(undefined4 *)((long)pvVar12 + lVar35 + lVar25) =
                   *(undefined4 *)((long)pvVar13 + lVar35 * 4 + lVar34 + 0xc);
              lVar35 = lVar35 + 4;
            }
            lVar30 = lVar30 + lVar26;
            lVar43 = lVar43 + lVar26;
            lVar25 = lVar25 + lVar26;
            uVar27 = (ulong)(uint)(iVar47 + iVar44 * 4);
          }
        }
        else {
          if (iVar22 != 8) {
            return 0;
          }
          uVar31 = 0;
          if ((int)uVar10 < 1) {
            uVar10 = uVar31;
          }
          lVar45 = lVar25 * 0x1c;
          lVar34 = lVar25 * 0x20;
          lVar35 = lVar25 * 0x18;
          lVar41 = lVar25 * 0x14;
          lVar26 = lVar25 << 4;
          local_100 = lVar25 * 0xc;
          local_108 = lVar25 * 8;
          lVar30 = lVar25 * 4;
          lVar43 = lVar30;
          for (uVar40 = 0; uVar40 != uVar10; uVar40 = uVar40 + 1) {
            lVar23 = (long)(int)uVar31;
            lVar46 = lVar43 + lVar23 * -4;
            pvVar12 = bottom_blob->data;
            puVar32 = (undefined4 *)
                      (uVar40 * (long)bottom_blob->w * bottom_blob->elemsize + (long)pvVar12);
            pvVar13 = top_blob->data;
            lVar39 = bottom_blob->elemsize * uVar40 * (long)bottom_blob->w;
            lVar38 = 0;
            lVar29 = 0;
            for (iVar47 = 0; iVar47 + 7 < iVar44; iVar47 = iVar47 + 8) {
              auVar2 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39);
              auVar3 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0x20);
              auVar4 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0x40);
              auVar5 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0x60);
              auVar6 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0x80);
              auVar7 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0xa0);
              auVar8 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0xc0);
              auVar9 = *(undefined1 (*) [32])((long)pvVar12 + lVar29 * 8 + lVar39 + 0xe0);
              auVar21 = vunpcklps_avx(auVar2,auVar3);
              auVar3 = vunpckhps_avx(auVar2,auVar3);
              auVar2 = vunpcklps_avx(auVar4,auVar5);
              auVar4 = vunpckhps_avx(auVar4,auVar5);
              auVar49 = vunpcklps_avx(auVar6,auVar7);
              auVar5 = vunpckhps_avx(auVar6,auVar7);
              auVar51 = vunpcklps_avx(auVar8,auVar9);
              auVar6 = vunpckhps_avx(auVar8,auVar9);
              auVar7 = vunpcklpd_avx(auVar21,auVar2);
              auVar2 = vunpckhpd_avx(auVar21,auVar2);
              auVar8 = vunpcklpd_avx(auVar3,auVar4);
              auVar3 = vunpckhpd_avx(auVar3,auVar4);
              auVar9 = vunpcklpd_avx(auVar49,auVar51);
              auVar4 = vunpckhpd_avx(auVar49,auVar51);
              auVar21 = vunpcklpd_avx(auVar5,auVar6);
              auVar5 = vunpckhpd_avx(auVar5,auVar6);
              auVar49._16_16_ = auVar9._0_16_;
              auVar49._0_16_ = auVar7._0_16_;
              auVar51._16_16_ = auVar4._0_16_;
              auVar51._0_16_ = auVar2._0_16_;
              auVar53._16_16_ = auVar21._0_16_;
              auVar53._0_16_ = auVar8._0_16_;
              auVar55._16_16_ = auVar5._0_16_;
              auVar55._0_16_ = auVar3._0_16_;
              auVar6 = vperm2f128_avx(auVar7,auVar9,0x31);
              auVar2 = vperm2f128_avx(auVar2,auVar4,0x31);
              auVar4 = vperm2f128_avx(auVar8,auVar21,0x31);
              auVar3 = vperm2f128_avx(auVar3,auVar5,0x31);
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar23 * 4) = auVar49;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar43) = auVar51;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + local_108) = auVar53;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + local_100) = auVar55;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar26) = auVar6;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar41) = auVar2;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar35) = auVar4;
              *(undefined1 (*) [32])((long)pvVar13 + lVar29 + lVar45) = auVar3;
              puVar32 = puVar32 + 0x40;
              lVar29 = lVar29 + 0x20;
              lVar38 = lVar38 + 8;
            }
            for (; (int)lVar38 < iVar44; lVar38 = lVar38 + 1) {
              puVar1 = (undefined4 *)((long)pvVar13 + lVar38 * 4 + lVar23 * 4);
              *puVar1 = *puVar32;
              *(undefined4 *)((long)puVar1 + lVar46) = puVar32[1];
              *(undefined4 *)((long)puVar1 + lVar30 + lVar46) = puVar32[2];
              *(undefined4 *)((long)puVar1 + lVar30 + lVar30 + lVar46) = puVar32[3];
              lVar29 = lVar30 + lVar30 + lVar46;
              *(undefined4 *)((long)puVar1 + lVar30 + lVar29) = puVar32[4];
              lVar29 = lVar30 + lVar29;
              *(undefined4 *)((long)puVar1 + lVar30 + lVar29) = puVar32[5];
              lVar29 = lVar30 + lVar29;
              *(undefined4 *)((long)puVar1 + lVar30 + lVar29) = puVar32[6];
              *(undefined4 *)((long)puVar1 + lVar25 * 8 + lVar29) = puVar32[7];
              puVar32 = puVar32 + 8;
            }
            lVar45 = lVar45 + lVar34;
            lVar35 = lVar35 + lVar34;
            lVar41 = lVar41 + lVar34;
            lVar26 = lVar26 + lVar34;
            local_100 = local_100 + lVar34;
            local_108 = local_108 + lVar34;
            lVar43 = lVar43 + lVar34;
            uVar31 = uVar31 + iVar44 * 8;
          }
        }
      }
      if (1 < iVar37 - 3U) {
        return 0;
      }
      lVar25 = (long)iVar33;
      if (iVar22 == 4) {
        iVar37 = 0;
        uVar40 = 0;
        if (0 < (int)uVar11) {
          uVar40 = uVar24;
        }
        lVar30 = lVar25 * 4;
        lVar26 = lVar25 * 0x10;
        lVar43 = lVar25 * 8;
        lVar34 = lVar25 * 0xc;
        for (uVar27 = 0; uVar27 != uVar40; uVar27 = uVar27 + 1) {
          Mat::channel(&local_78,bottom_blob,(int)uVar27);
          pvVar13 = local_78.data;
          Mat::~Mat(&local_78);
          pvVar12 = top_blob->data;
          lVar35 = 0;
          for (iVar44 = 0; iVar44 + 3 < iVar33; iVar44 = iVar44 + 4) {
            auVar19 = vunpcklps_avx(*(undefined1 (*) [16])((undefined1 *)pvVar13 + lVar35 * 4),
                                    *(undefined1 (*) [16])
                                     ((undefined1 *)pvVar13 + lVar35 * 4 + 0x10));
            auVar20 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0x20) + lVar35 * 4),
                                    *(undefined1 (*) [16])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0x20) +
                                     lVar35 * 4 + 0x10));
            auVar15 = vunpckhps_avx(*(undefined1 (*) [16])((undefined1 *)pvVar13 + lVar35 * 4),
                                    *(undefined1 (*) [16])
                                     ((undefined1 *)pvVar13 + lVar35 * 4 + 0x10));
            auVar16 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0x20) + lVar35 * 4),
                                    *(undefined1 (*) [16])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0x20) +
                                     lVar35 * 4 + 0x10));
            auVar14 = vmovlhps_avx(auVar19,auVar20);
            auVar20 = vunpckhpd_avx(auVar19,auVar20);
            auVar19 = vmovlhps_avx(auVar15,auVar16);
            auVar15 = vunpckhpd_avx(auVar15,auVar16);
            *(undefined1 (*) [16])((long)pvVar12 + lVar35 + (long)iVar37 * 4) = auVar14;
            *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar30) = auVar20;
            *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar43) = auVar19;
            *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar34) = auVar15;
            lVar35 = lVar35 + 0x10;
          }
          for (; iVar44 < iVar33; iVar44 = iVar44 + 1) {
            *(undefined4 *)((long)pvVar12 + lVar35 + (long)iVar37 * 4) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar35 * 4);
            *(undefined4 *)((long)pvVar12 + lVar35 + lVar30) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar35 * 4 + 4);
            *(undefined4 *)((long)pvVar12 + lVar35 + lVar43) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar35 * 4 + 8);
            *(undefined4 *)((long)pvVar12 + lVar35 + lVar34) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar35 * 4 + 0xc);
            lVar35 = lVar35 + 4;
          }
          iVar37 = iVar37 + iVar33 * 4;
          lVar30 = lVar30 + lVar26;
          lVar43 = lVar43 + lVar26;
          lVar34 = lVar34 + lVar26;
        }
      }
      else if (iVar22 == 8) {
        iVar37 = 0;
        uVar40 = 0;
        if (0 < (int)uVar11) {
          uVar40 = uVar24;
        }
        lVar30 = lVar25 * 4;
        lVar43 = lVar25 * 0x20;
        local_120 = lVar25 * 8;
        local_110 = lVar25 * 0xc;
        local_118 = lVar25 << 4;
        local_100 = lVar25 * 0x14;
        local_108 = lVar25 * 0x18;
        local_e0 = lVar25 * 0x1c;
        for (uVar27 = 0; uVar27 != uVar40; uVar27 = uVar27 + 1) {
          Mat::channel(&local_78,bottom_blob,(int)uVar27);
          pvVar13 = local_78.data;
          Mat::~Mat(&local_78);
          pvVar12 = top_blob->data;
          lVar26 = 0;
          for (iVar44 = 0; iVar44 + 7 < iVar33; iVar44 = iVar44 + 8) {
            auVar2 = vunpcklps_avx(*(undefined1 (*) [32])((undefined1 *)pvVar13 + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x20) + lVar26 * 8));
            auVar3 = vunpckhps_avx(*(undefined1 (*) [32])((undefined1 *)pvVar13 + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x20) + lVar26 * 8));
            auVar8 = vunpcklps_avx(*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x40) + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x60) + lVar26 * 8));
            auVar4 = vunpckhps_avx(*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x40) + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x60) + lVar26 * 8));
            auVar21 = vunpcklps_avx(*(undefined1 (*) [32])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0x80) + lVar26 * 8),
                                    *(undefined1 (*) [32])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0xa0) + lVar26 * 8));
            auVar5 = vunpckhps_avx(*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0x80) + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0xa0) + lVar26 * 8));
            auVar49 = vunpcklps_avx(*(undefined1 (*) [32])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0xc0) + lVar26 * 8),
                                    *(undefined1 (*) [32])
                                     (*(undefined1 (*) [32])((long)pvVar13 + 0xe0) + lVar26 * 8));
            auVar6 = vunpckhps_avx(*(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0xc0) + lVar26 * 8),
                                   *(undefined1 (*) [32])
                                    (*(undefined1 (*) [32])((long)pvVar13 + 0xe0) + lVar26 * 8));
            auVar7 = vunpcklpd_avx(auVar2,auVar8);
            auVar2 = vunpckhpd_avx(auVar2,auVar8);
            auVar8 = vunpcklpd_avx(auVar3,auVar4);
            auVar3 = vunpckhpd_avx(auVar3,auVar4);
            auVar9 = vunpcklpd_avx(auVar21,auVar49);
            auVar4 = vunpckhpd_avx(auVar21,auVar49);
            auVar21 = vunpcklpd_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            auVar50._16_16_ = auVar9._0_16_;
            auVar50._0_16_ = auVar7._0_16_;
            auVar52._16_16_ = auVar4._0_16_;
            auVar52._0_16_ = auVar2._0_16_;
            auVar54._16_16_ = auVar21._0_16_;
            auVar54._0_16_ = auVar8._0_16_;
            auVar56._16_16_ = auVar5._0_16_;
            auVar56._0_16_ = auVar3._0_16_;
            auVar6 = vperm2f128_avx(auVar7,auVar9,0x31);
            auVar2 = vperm2f128_avx(auVar2,auVar4,0x31);
            auVar4 = vperm2f128_avx(auVar8,auVar21,0x31);
            auVar3 = vperm2f128_avx(auVar3,auVar5,0x31);
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + (long)iVar37 * 4) = auVar50;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + lVar30) = auVar52;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_120) = auVar54;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_110) = auVar56;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_118) = auVar6;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_100) = auVar2;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_108) = auVar4;
            *(undefined1 (*) [32])((long)pvVar12 + lVar26 + local_e0) = auVar3;
            lVar26 = lVar26 + 0x20;
          }
          for (; iVar44 < iVar33; iVar44 = iVar44 + 1) {
            *(undefined4 *)((long)pvVar12 + lVar26 + (long)iVar37 * 4) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8);
            *(undefined4 *)((long)pvVar12 + lVar26 + lVar30) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 4);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_120) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 8);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_110) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 0xc);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_118) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 0x10);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_100) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 0x14);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_108) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 0x18);
            *(undefined4 *)((long)pvVar12 + lVar26 + local_e0) =
                 *(undefined4 *)((undefined1 *)pvVar13 + lVar26 * 8 + 0x1c);
            lVar26 = lVar26 + 4;
          }
          iVar37 = iVar37 + iVar33 * 8;
          lVar30 = lVar30 + lVar43;
          local_120 = local_120 + lVar43;
          local_110 = local_110 + lVar43;
          local_118 = local_118 + lVar43;
          local_100 = local_100 + lVar43;
          local_108 = local_108 + lVar43;
          local_e0 = local_e0 + lVar43;
        }
      }
      if (iVar22 != 1) {
        return 0;
      }
      if ((int)uVar11 < 1) {
        uVar24 = 0;
      }
      lVar30 = 0;
      for (uVar40 = 0; uVar40 != uVar24; uVar40 = uVar40 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar40);
        pvVar13 = local_78.data;
        Mat::~Mat(&local_78);
        pvVar12 = top_blob->data;
        pauVar28 = (undefined1 (*) [32])((long)pvVar12 + uVar40 * lVar25 * 4);
        lVar43 = 0;
        pauVar36 = (undefined1 (*) [32])pvVar13;
        for (iVar22 = 0; iVar22 + 7 < iVar33; iVar22 = iVar22 + 8) {
          *pauVar28 = *pauVar36;
          pauVar36 = pauVar36 + 1;
          pauVar28 = pauVar28 + 1;
          lVar43 = lVar43 + 8;
        }
        for (; (int)lVar43 < iVar33; lVar43 = lVar43 + 1) {
          *(undefined4 *)((long)pvVar12 + lVar43 * 4 + lVar30) =
               *(undefined4 *)((undefined1 *)pvVar13 + lVar43 * 4);
        }
        lVar30 = lVar30 + lVar25 * 4;
      }
    }
  }
  return 0;
}

Assistant:

int Flatten_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}